

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O1

vector<UniValue,_std::allocator<UniValue>_> *
JSONRPCProcessBatchReply
          (vector<UniValue,_std::allocator<UniValue>_> *__return_storage_ptr__,UniValue *in)

{
  pointer pUVar1;
  pointer pUVar2;
  int iVar3;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar4;
  UniValue *this;
  ulong uVar5;
  runtime_error *prVar6;
  size_type __n;
  pointer this_00;
  long in_FS_OFFSET;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (in->typ == VARR) {
    __n = ((long)(in->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              (__return_storage_ptr__,__n,(allocator_type *)&local_58);
    pvVar4 = UniValue::getValues(in);
    this_00 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pUVar1 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_00 != pUVar1) {
      do {
        if (this_00->typ != VOBJ) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"Batch member must be an object");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00380600;
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"id","");
        this = UniValue::operator[](this_00,&local_58);
        iVar3 = UniValue::getInt<int>(this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        uVar5 = (ulong)iVar3;
        if (__n <= uVar5) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"Batch member id is larger than batch size");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00380600;
        }
        pUVar2 = (__return_storage_ptr__->super__Vector_base<UniValue,_std::allocator<UniValue>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pUVar2[uVar5].typ = this_00->typ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&pUVar2[uVar5].val,&this_00->val);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pUVar2[uVar5].keys,&this_00->keys);
        std::vector<UniValue,_std::allocator<UniValue>_>::operator=
                  (&pUVar2[uVar5].values,&this_00->values);
        this_00 = this_00 + 1;
      } while (this_00 != pUVar1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  else {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Batch must be an array");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_00380600:
  __stack_chk_fail();
}

Assistant:

std::vector<UniValue> JSONRPCProcessBatchReply(const UniValue& in)
{
    if (!in.isArray()) {
        throw std::runtime_error("Batch must be an array");
    }
    const size_t num {in.size()};
    std::vector<UniValue> batch(num);
    for (const UniValue& rec : in.getValues()) {
        if (!rec.isObject()) {
            throw std::runtime_error("Batch member must be an object");
        }
        size_t id = rec["id"].getInt<int>();
        if (id >= num) {
            throw std::runtime_error("Batch member id is larger than batch size");
        }
        batch[id] = rec;
    }
    return batch;
}